

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

int chacha_test_multiblock_incremental(chacha_key *key,chacha_iv *iv,uint8_t *in,uint8_t *out)

{
  int iVar1;
  size_t sVar2;
  uint8_t *dst;
  uint8_t *in_RCX;
  long in_RDX;
  int res;
  uint8_t *p;
  size_t inc;
  size_t i;
  uint8_t final [64];
  chacha_state st;
  uint8_t *in_stack_fffffffffffffed8;
  uint8_t *in_stack_fffffffffffffee0;
  uint8_t *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  uint uVar3;
  uint8_t *in_00;
  uint8_t *S;
  undefined1 local_e8 [200];
  uint8_t *local_20;
  long local_18;
  
  uVar3 = 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (in_00 = (uint8_t *)0x1; in_00 < (uint8_t *)0x800; in_00 = in_00 + 0x3d) {
    dst = local_20;
    memset(local_20,0,0x800);
    chacha_test_init_state
              ((chacha_state *)in_stack_fffffffffffffee0,(chacha_key *)in_stack_fffffffffffffed8,
               (chacha_iv *)0x1eb455);
    for (S = (uint8_t *)0x0; S < (uint8_t *)0x801; S = in_00 + (long)S) {
      if (local_18 == 0) {
        in_stack_fffffffffffffee0 = (uint8_t *)0x0;
      }
      else {
        in_stack_fffffffffffffee0 = S + local_18;
      }
      in_stack_fffffffffffffed8 = in_00;
      if ((uint8_t *)0x800 < S + (long)in_00) {
        in_stack_fffffffffffffed8 = (uint8_t *)(0x800 - (long)S);
      }
      in_stack_fffffffffffffef0 = in_stack_fffffffffffffee0;
      sVar2 = chacha_update((chacha_state *)S,in_00,dst,CONCAT44(uVar3,in_stack_fffffffffffffef8));
      dst = dst + sVar2;
    }
    chacha_final((chacha_state *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    chacha_test_compact_array
              (dst,(uint8_t *)CONCAT44(uVar3,in_stack_fffffffffffffef8),
               (size_t)in_stack_fffffffffffffef0);
    iVar1 = memcmp(expected_chacha,local_e8,0x40);
    uVar3 = iVar1 == 0 & uVar3;
  }
  return uVar3;
}

Assistant:

static int
chacha_test_multiblock_incremental(chacha_key *key, chacha_iv *iv, const uint8_t *in, uint8_t *out) {
    chacha_state st;
    uint8_t final[CHACHA_BLOCKBYTES];
    size_t i, inc;
    uint8_t *p;
    int res = 1;

    for (inc = 1; inc < CHACHA_TEST_LEN; inc += 61) {
        p = out;
        memset(out, 0, CHACHA_TEST_LEN);
        chacha_test_init_state(&st, key, iv);
        for(i = 0; i <= CHACHA_TEST_LEN; i += inc)
            p += chacha_update(&st, (in) ? (in + i) : NULL, p, ((i + inc) > CHACHA_TEST_LEN) ? (CHACHA_TEST_LEN - i) : inc);
        chacha_final(&st, p);
        chacha_test_compact_array(final, out, CHACHA_TEST_LEN);
        res &= (memcmp(expected_chacha, final, sizeof(expected_chacha)) == 0) ? 1 : 0;
    }

    return res;
}